

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O2

void fdjac2(custom_funcmult *funcmult,double *x,int M,int N,double *fvec,double *fjac,int ldfjac,
           double epsfcn,double eps)

{
  double dVar1;
  double dVar2;
  double *__ptr;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double *local_40;
  
  dVar8 = pmax(epsfcn,eps);
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  __ptr = (double *)malloc((long)M * 8);
  uVar5 = 0;
  uVar6 = 0;
  if (0 < M) {
    uVar6 = (ulong)(uint)M;
  }
  uVar4 = 0;
  local_40 = fjac;
  if (0 < N) {
    uVar4 = (ulong)(uint)N;
  }
  for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    dVar1 = x[uVar5];
    uVar7 = -(ulong)(ABS(dVar1) * dVar8 == 0.0);
    dVar2 = (double)(uVar7 & (ulong)dVar8 | ~uVar7 & (ulong)(ABS(dVar1) * dVar8));
    x[uVar5] = dVar2 + dVar1;
    (*funcmult->funcmult)(x,M,N,__ptr,funcmult->params);
    x[uVar5] = dVar1;
    pdVar3 = local_40;
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      *pdVar3 = (__ptr[uVar7] - fvec[uVar7]) / dVar2;
      pdVar3 = pdVar3 + N;
    }
    local_40 = local_40 + 1;
  }
  free(__ptr);
  return;
}

Assistant:

void fdjac2(custom_funcmult *funcmult, double *x, int M, int N, double *fvec, double *fjac, int ldfjac,
		double epsfcn,double eps) {
	int i,j;
	double epsmch,h,temp,zero;
	double *wa;

	zero = 0.0;
	epsmch = eps;
	eps = sqrt(pmax(epsfcn,epsmch));

	wa = (double*) malloc(sizeof(double) *M);

	for(j = 0; j < N;++j) {
        temp = x[j];
        h = eps*fabs(temp);
        if (h == zero) {
        	h = eps;
        }
        x[j] = temp + h;
        FUNCMULT_EVAL(funcmult,x,M,N,wa);
        x[j] = temp;
        for(i = 0; i < M;++i) {
        	fjac[i*N+j] = (wa[i] - fvec[i])/h;
        }
	}

	free(wa);

}